

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v10::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  char *end;
  unsigned_long uStack_48;
  int size_local;
  unsigned_long value_local;
  char *out_local;
  
  iVar2 = count_digits(value);
  if (size < iVar2) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h"
                ,0x51e,"invalid digit count");
  }
  value_local = (unsigned_long)(out + size);
  for (uStack_48 = value; 99 < uStack_48; uStack_48 = uStack_48 / 100) {
    value_local = value_local - 2;
    pcVar3 = digits2(uStack_48 % 100);
    *(undefined2 *)value_local = *(undefined2 *)pcVar3;
  }
  if (uStack_48 < 10) {
    out_local = (char *)(value_local - 1);
    *(char *)(value_local - 1) = (char)uStack_48 + '0';
  }
  else {
    out_local = (char *)(value_local - 2);
    pcVar3 = digits2(uStack_48);
    *(undefined2 *)out_local = *(undefined2 *)pcVar3;
  }
  fVar1.end = out + size;
  fVar1.begin = out_local;
  return fVar1;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}